

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O1

RC __thiscall SM_Manager::SetUpPrint(SM_Manager *this,RelCatEntry *rEntry,DataAttrInfo *attributes)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  RC RVar6;
  int iVar7;
  RID attrRID;
  AttrCatEntry *aEntry;
  RM_Record attrRec;
  SM_AttrIterator attrIt;
  RID local_c0;
  AttrCatEntry *local_b8;
  RM_Record local_b0;
  SM_AttrIterator local_98;
  
  RID::RID(&local_c0);
  RM_Record::RM_Record(&local_b0);
  SM_AttrIterator::SM_AttrIterator(&local_98);
  RVar6 = SM_AttrIterator::OpenIterator(&local_98,&this->attrcatFH,rEntry->relName);
  if (RVar6 == 0) {
    bVar2 = 0 < rEntry->attrCount;
    if (0 < rEntry->attrCount) {
      iVar7 = 0;
      do {
        RVar6 = SM_AttrIterator::GetNextAttr(&local_98,&local_b0,&local_b8);
        if (RVar6 != 0) break;
        iVar1 = local_b8->attrNum;
        uVar3 = *(undefined8 *)local_b8->relName;
        uVar4 = *(undefined8 *)(local_b8->relName + 8);
        uVar5 = *(undefined8 *)(local_b8->relName + 0x11);
        *(undefined8 *)(attributes[iVar1].relName + 9) = *(undefined8 *)(local_b8->relName + 9);
        *(undefined8 *)(attributes[iVar1].relName + 9 + 8) = uVar5;
        *(undefined8 *)attributes[iVar1].relName = uVar3;
        *(undefined8 *)(attributes[iVar1].relName + 8) = uVar4;
        uVar3 = *(undefined8 *)(local_b8->attrName + 8);
        uVar4 = *(undefined8 *)(local_b8->attrName + 9);
        uVar5 = *(undefined8 *)(local_b8->attrName + 0x11);
        *(undefined8 *)attributes[iVar1].attrName = *(undefined8 *)local_b8->attrName;
        *(undefined8 *)(attributes[iVar1].attrName + 8) = uVar3;
        *(undefined8 *)(attributes[iVar1].attrName + 9) = uVar4;
        *(undefined8 *)(attributes[iVar1].attrName + 9 + 8) = uVar5;
        attributes[iVar1].offset = local_b8->offset;
        attributes[iVar1].attrType = local_b8->attrType;
        attributes[iVar1].attrLength = local_b8->attrLength;
        attributes[iVar1].indexNo = local_b8->indexNo;
        iVar7 = iVar7 + 1;
        bVar2 = iVar7 < rEntry->attrCount;
      } while (iVar7 < rEntry->attrCount);
    }
    if (!bVar2) {
      RVar6 = SM_AttrIterator::CloseIterator(&local_98);
    }
  }
  SM_AttrIterator::~SM_AttrIterator(&local_98);
  RM_Record::~RM_Record(&local_b0);
  RID::~RID(&local_c0);
  return RVar6;
}

Assistant:

RC SM_Manager::SetUpPrint(RelCatEntry* rEntry, DataAttrInfo *attributes){
  RC rc = 0;
  RID attrRID;
  RM_Record attrRec;
  AttrCatEntry *aEntry;

  // Iterate through attrcat for attributes related to this relation
  SM_AttrIterator attrIt;
  if((rc = attrIt.OpenIterator(attrcatFH, rEntry->relName)))
    return (rc);

  for(int i=0; i < rEntry->attrCount; i++){
    if((rc = attrIt.GetNextAttr(attrRec, aEntry))){
      return (rc);
    }
    int slot = aEntry->attrNum; // insert its info in the appropriate slot

    memcpy(attributes[slot].relName, aEntry->relName, MAXNAME + 1);
    memcpy(attributes[slot].attrName, aEntry->attrName, MAXNAME + 1);
    attributes[slot].offset = aEntry->offset;
    attributes[slot].attrType = aEntry->attrType;
    attributes[slot].attrLength = aEntry->attrLength;
    attributes[slot].indexNo = aEntry->indexNo;
  }
  if((rc = attrIt.CloseIterator()))
    return (rc);

  return (rc);
}